

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

LoopBlocks * __thiscall spv::Builder::makeNewLoop(Builder *this)

{
  Block *pBVar1;
  Block *pBVar2;
  Block *pBVar3;
  _Elt_pointer pLVar4;
  LoopBlocks blocks;
  value_type local_40;
  
  pBVar1 = makeNewBlock(this);
  pBVar2 = makeNewBlock(this);
  pBVar3 = makeNewBlock(this);
  local_40.continue_target = makeNewBlock(this);
  local_40.head = pBVar1;
  local_40.body = pBVar2;
  local_40.merge = pBVar3;
  std::deque<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>::push_back
            (&(this->loops).c,&local_40);
  pLVar4 = (this->loops).c.
           super__Deque_base<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pLVar4 == (this->loops).c.
                super__Deque_base<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pLVar4 = (this->loops).c.
             super__Deque_base<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  return pLVar4 + -1;
}

Assistant:

Builder::LoopBlocks& Builder::makeNewLoop()
{
    // This verbosity is needed to simultaneously get the same behavior
    // everywhere (id's in the same order), have a syntax that works
    // across lots of versions of C++, have no warnings from pedantic
    // compilation modes, and leave the rest of the code alone.
    Block& head            = makeNewBlock();
    Block& body            = makeNewBlock();
    Block& merge           = makeNewBlock();
    Block& continue_target = makeNewBlock();
    LoopBlocks blocks(head, body, merge, continue_target);
    loops.push(blocks);
    return loops.top();
}